

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toinst.cpp
# Opt level: O2

unique_ptr<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_> *
toInst(unique_ptr<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_>
       *__return_storage_ptr__,ConstantExpr *ce)

{
  pointer __p;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  __p = (pointer)llvm::ConstantExpr::getAsInstruction((Instruction *)ce);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(llvm::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/staticafi[P]llvm2c/parser/toinst.cpp:7:9)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(llvm::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/staticafi[P]llvm2c/parser/toinst.cpp:7:9)>
             ::_M_manager;
  std::__uniq_ptr_impl<llvm::Instruction,std::function<void(llvm::Instruction*)>>::
  __uniq_ptr_impl<std::function<void(llvm::Instruction*)>>
            ((__uniq_ptr_impl<llvm::Instruction,std::function<void(llvm::Instruction*)>> *)
             __return_storage_ptr__,__p,(function<void_(llvm::Instruction_*)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::unique_ptr<llvm::Instruction, std::function<void(llvm::Instruction*)>> toInst(
    llvm::ConstantExpr* ce){
    return std::unique_ptr<llvm::Instruction, std::function<void(llvm::Instruction*)>>(
        ce->getAsInstruction(),
        [](llvm::Instruction* inst) { inst->deleteValue(); }
    );
}